

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

bool __thiscall embree::TokenStream::tryInt(TokenStream *this,Token *token,ParseLocation *loc)

{
  bool bVar1;
  char *__nptr;
  string *in_RSI;
  TokenStream *in_RDI;
  string str;
  Token *in_stack_ffffffffffffff48;
  string *this_00;
  int i;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff64;
  string local_40 [40];
  TokenStream *this_01;
  
  this_00 = local_40;
  this_01 = in_RDI;
  std::__cxx11::string::string(this_00);
  i = (int)((ulong)this_00 >> 0x20);
  bVar1 = decDigits(this_01,in_RSI);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff60);
  if (bVar1) {
    __nptr = (char *)std::__cxx11::string::c_str();
    atoi(__nptr);
    Token::Token((Token *)CONCAT44(in_stack_ffffffffffffff64,uVar2),i,(ParseLocation *)in_RDI);
    Token::operator=((Token *)in_RDI,in_stack_ffffffffffffff48);
    Token::~Token((Token *)in_RDI);
  }
  std::__cxx11::string::~string(local_40);
  return bVar1;
}

Assistant:

bool TokenStream::tryInt(Token& token, const ParseLocation& loc) {
    std::string str;
    if (decDigits(str)) {
      token = Token(atoi(str.c_str()),loc);
      return true;
    }
    return false;
  }